

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void utime_cb(uv_fs_t *req)

{
  utime_check_t *c;
  uv_fs_t *req_local;
  
  if (req != &utime_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x361,"req == &utime_req");
    abort();
  }
  if (utime_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x362,"req->result == 0");
    abort();
  }
  if (utime_req.fs_type != UV_FS_UTIME) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x363,"req->fs_type == UV_FS_UTIME");
    abort();
  }
  check_utime(*utime_req.data,*(double *)((long)utime_req.data + 8),
              *(double *)((long)utime_req.data + 0x10),0);
  uv_fs_req_cleanup(&utime_req);
  utime_cb_count = utime_cb_count + 1;
  return;
}

Assistant:

static void utime_cb(uv_fs_t* req) {
  utime_check_t* c;

  ASSERT(req == &utime_req);
  ASSERT(req->result == 0);
  ASSERT(req->fs_type == UV_FS_UTIME);

  c = req->data;
  check_utime(c->path, c->atime, c->mtime, /* test_lutime */ 0);

  uv_fs_req_cleanup(req);
  utime_cb_count++;
}